

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-to-vpack.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  char *pcVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar9;
  uint8_t *puVar10;
  ostream *poVar11;
  bool bVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  uint64_t id;
  element_type *peVar16;
  int iVar17;
  _Hash_node_base *p_Var18;
  long lVar19;
  char *pcVar20;
  __node_base _Var21;
  string_view key;
  string infile;
  shared_ptr<arangodb::velocypack::Builder> builder_1;
  shared_ptr<arangodb::velocypack::Builder> builder;
  string s;
  Parser parser;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  keysFound;
  ofstream ofs;
  ifstream ifs;
  char buffer [32768];
  int local_85c0;
  char *local_85b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_85a8;
  _Any_data local_8588;
  code *local_8578;
  code *pcStack_8570;
  undefined1 local_8568 [16];
  undefined1 local_8558 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8538;
  ulong local_8518;
  ulong local_8510;
  undefined1 local_8508 [36];
  undefined8 local_84e4;
  uint32_t local_84dc;
  pointer local_84c8;
  _Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false> local_84c0;
  undefined5 uStack_84b8;
  int iStack_84b3;
  uint uStack_84af;
  undefined4 local_84ab;
  undefined2 local_84a7;
  bool local_84a5;
  undefined8 local_84a4;
  uint32_t local_849c;
  undefined1 local_8498 [16];
  __node_base local_8488;
  _Alloc_hider _Stack_8480;
  float local_8478;
  undefined1 local_8470 [16];
  _Alloc_hider local_8460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8450;
  undefined1 local_8440 [8];
  _Alloc_hider local_8438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8428;
  _Head_base<0UL,_unsigned_long,_false> local_8418;
  ios_base local_8348 [264];
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  char local_8038 [32776];
  
  local_8518 = 0;
  bVar6 = 1;
  iVar17 = 1;
  local_8510 = 0;
  bVar3 = false;
  bVar12 = true;
  local_85b0 = (char *)0x0;
  pcVar14 = (char *)0x0;
  local_85c0 = 0;
  while (iVar17 < argc) {
    pcVar20 = argv[iVar17];
    pcVar15 = pcVar14;
    pcVar5 = local_85b0;
    if (bVar12) {
      iVar8 = strcmp(pcVar20,"--help");
      if (iVar8 != 0) {
        iVar8 = strcmp(pcVar20,"--compact");
        if (iVar8 == 0) {
          bVar6 = 1;
        }
        else {
          iVar8 = strcmp(pcVar20,"--no-compact");
          if (iVar8 == 0) {
            bVar6 = 0;
          }
          else {
            iVar8 = strcmp(pcVar20,"--compress");
            if (iVar8 == 0) {
              bVar3 = true;
            }
            else {
              iVar8 = strcmp(pcVar20,"--no-compress");
              if (iVar8 == 0) {
                bVar3 = false;
              }
              else {
                iVar8 = strcmp(pcVar20,"--hex");
                if (iVar8 == 0) {
                  local_8510 = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
                }
                else {
                  iVar8 = strcmp(pcVar20,"--stringify");
                  if (iVar8 == 0) {
                    local_8518 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar8) >> 8),1);
                  }
                  else {
                    iVar8 = strcmp(pcVar20,"--");
                    if (iVar8 != 0) goto LAB_00104571;
                    bVar12 = false;
                  }
                }
              }
            }
          }
        }
        goto LAB_001045f2;
      }
      bVar2 = false;
      usage(argv);
      local_85c0 = 0;
    }
    else {
LAB_00104571:
      pcVar15 = pcVar20;
      if ((pcVar14 == (char *)0x0) ||
         (pcVar15 = pcVar14, pcVar5 = pcVar20, local_85b0 == (char *)0x0)) {
LAB_001045f2:
        local_85b0 = pcVar5;
        iVar17 = iVar17 + 1;
        bVar2 = true;
        pcVar14 = pcVar15;
      }
      else {
        usage(argv);
        local_85c0 = 1;
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return local_85c0;
    }
  }
  pcVar20 = "-";
  if (pcVar14 != (char *)0x0) {
    pcVar20 = pcVar14;
  }
  if ((local_85b0 == (char *)0x0) || (iVar17 = strcmp(local_85b0,"+"), iVar17 == 0)) {
    local_85b0 = "/proc/self/fd/1";
    bVar12 = true;
  }
  else {
    bVar12 = false;
  }
  local_85a8._M_dataplus._M_p = (pointer)&local_85a8.field_2;
  sVar9 = strlen(pcVar20);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_85a8,pcVar20,pcVar20 + sVar9);
  iVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_85a8,"-");
  if (iVar17 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_85a8,0,local_85a8._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_8538._M_dataplus._M_p = (pointer)&local_8538.field_2;
  local_8538._M_string_length = 0;
  local_8538.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_8240,(string *)&local_85a8,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_85a8._M_dataplus._M_p,
                         local_85a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    local_85c0 = 1;
    std::ostream::flush();
    goto LAB_00105242;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&local_8538,0x8000);
  while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
    std::istream::read((char *)&local_8240,(long)local_8038);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_8538,local_8038,local_8238);
  }
  std::ifstream::close();
  local_84c8 = (pointer)0x200000002;
  local_84c0._M_head_impl = (AttributeTranslator *)0x0;
  uStack_84b8 = 0;
  local_84ab._0_1_ = true;
  local_84ab._1_1_ = false;
  local_84ab._2_1_ = false;
  local_84ab._3_1_ = false;
  local_84a7._0_1_ = true;
  local_84a7._1_1_ = false;
  local_84a5 = true;
  local_84a4._0_1_ = false;
  local_84a4._1_1_ = false;
  local_84a4._2_1_ = false;
  local_84a4._3_1_ = false;
  local_84a4._4_1_ = false;
  local_84a4._5_1_ = false;
  local_84a4._6_1_ = false;
  local_84a4._7_1_ = false;
  local_849c = 0xffffffff;
  iStack_84b3 = (uint)bVar6 << 0x18;
  uStack_84af = (uint)bVar6;
  if (bVar3) {
    local_8498._0_8_ = local_8470 + 8;
    local_8498._8_8_ = 1;
    local_8488._M_nxt = (_Hash_node_base *)0x0;
    _Stack_8480._M_p = (pointer)0x0;
    local_8478 = 1.0;
    local_8470._0_8_ = 0;
    local_8470._8_8_ = (__node_base_ptr)0x0;
    local_8508._0_8_ = (element_type *)0x200000002;
    local_8508._8_8_ = (AttributeTranslator *)0x0;
    local_8508[0x10] = '\0';
    local_8508[0x11] = '\0';
    local_8508[0x12] = '\0';
    local_8508[0x13] = '\0';
    local_8508[0x14] = '\0';
    local_8508[0x15] = '\0';
    local_8508[0x16] = '\0';
    local_8508[0x17] = '\0';
    local_8508[0x18] = false;
    local_8508[0x19] = false;
    local_8508[0x1a] = false;
    local_8508[0x1b] = false;
    local_8508[0x1c] = false;
    local_8508._29_4_ = 1;
    local_8508[0x21] = true;
    local_8508[0x22] = false;
    local_8508[0x23] = true;
    local_84e4 = 0;
    local_84dc = 0xffffffff;
    arangodb::velocypack::Parser::Parser((Parser *)local_8440,(Options *)local_8508);
    arangodb::velocypack::Parser::parse
              ((Parser *)local_8440,(uint8_t *)local_8538._M_dataplus._M_p,
               local_8538._M_string_length,false);
    arangodb::velocypack::Parser::steal((Parser *)local_8568);
    if (*(ValueLength *)(local_8568._0_8_ + 0x20) == 0) {
      puVar10 = "";
    }
    else {
      puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8568._0_8_);
    }
    local_8588._8_8_ = 0;
    local_8588._M_unused._M_object = local_8498;
    pcStack_8570 = std::
                   _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                   ::_M_invoke;
    local_8578 = std::
                 _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/tools/json-to-vpack.cpp:85:9)>
                 ::_M_manager;
    arangodb::velocypack::Collection::visitRecursive
              ((Slice)puVar10,PreOrder,
               (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)
               &local_8588);
    if (local_8578 != (code *)0x0) {
      (*local_8578)(&local_8588,&local_8588,3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8568._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8568._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8438._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8438._M_p);
    }
    local_8508._0_8_ = (element_type *)0x0;
    local_8508._8_8_ = (element_type *)0x0;
    local_8508[0x10] = '\0';
    local_8508[0x11] = '\0';
    local_8508[0x12] = '\0';
    local_8508[0x13] = '\0';
    local_8508[0x14] = '\0';
    local_8508[0x15] = '\0';
    local_8508[0x16] = '\0';
    local_8508[0x17] = '\0';
    if (local_8488._M_nxt == (_Hash_node_base *)0x0) {
      lVar19 = 0;
    }
    else {
      p_Var18 = (_Hash_node_base *)0x2;
      lVar19 = 0;
      id = 0;
      _Var21._M_nxt = local_8488._M_nxt;
      do {
        if (((_Hash_node_base *)0x1 < _Var21._M_nxt[5]._M_nxt) &&
           (p_Var18 <= _Var21._M_nxt[2]._M_nxt)) {
          id = id + 1;
          key._M_str = (char *)_Var21._M_nxt[1]._M_nxt;
          key._M_len = (size_t)_Var21._M_nxt[2]._M_nxt;
          arangodb::velocypack::AttributeTranslator::add
                    ((AttributeTranslator *)
                     translator._M_t.
                     super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
                     _M_head_impl,key,id);
          local_8440 = (undefined1  [8])_Var21._M_nxt[5]._M_nxt;
          local_8438._M_p = (pointer)&local_8428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_8438,_Var21._M_nxt[1]._M_nxt,
                     (long)&(_Var21._M_nxt[1]._M_nxt)->_M_nxt +
                     (long)&(_Var21._M_nxt[2]._M_nxt)->_M_nxt);
          local_8418._M_head_impl = id;
          std::
          vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
          ::emplace_back<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>
                    ((vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
                      *)local_8508,
                     (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      *)local_8440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8438._M_p != &local_8428) {
            operator_delete(local_8438._M_p,(ulong)(local_8428._M_allocated_capacity + 1));
          }
          if (*(long *)((long)translator._M_t.
                              super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                              .
                              super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                              ._M_head_impl + 0x78) == 0xff) {
            p_Var18 = (_Hash_node_base *)0x3;
          }
          lVar19 = (long)&(_Var21._M_nxt[5]._M_nxt)->_M_nxt + lVar19;
        }
        _Var21._M_nxt = (_Var21._M_nxt)->_M_nxt;
      } while (_Var21._M_nxt != (_Hash_node_base *)0x0);
    }
    arangodb::velocypack::AttributeTranslator::seal
              ((AttributeTranslator *)
               translator._M_t.
               super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               ._M_t.
               super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
               .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>.
               _M_head_impl);
    local_84c0._M_head_impl =
         (AttributeTranslator *)
         translator._M_t.
         super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         ._M_t.
         super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
         .super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>._M_head_impl;
    if (lVar19 != 0 && !bVar12) {
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," occurrences of Object keys will be stored compressed:",0x36);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      uVar4 = local_8508._8_8_;
      if (local_8508._0_8_ != local_8508._8_8_) {
        lVar19 = 0;
        uVar13 = 0;
        peVar1 = (element_type *)local_8508._0_8_;
        do {
          peVar16 = (element_type *)((long)(peVar1->_arena).buf_ + 8);
          if (uVar13 < 0x14) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - #",4);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)(peVar1->_buffer).
                                                 super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi,(long)peVar1->_bufferPtr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," (",2);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," occurrences)",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - ... ",7);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," Object key(s) follow ...",0x19);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          }
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if (lVar19 == -0x14) break;
          lVar19 = lVar19 + -1;
          uVar13 = uVar13 + 1;
          peVar1 = peVar16;
        } while (peVar16 != (element_type *)uVar4);
      }
    }
    std::
    vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~vector((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_8508);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_8498);
  }
  local_84ab._1_1_ = true;
  arangodb::velocypack::Parser::Parser((Parser *)local_8508,(Options *)&local_84c8);
  arangodb::velocypack::Parser::parse
            ((Parser *)local_8508,(uint8_t *)local_8538._M_dataplus._M_p,local_8538._M_string_length
             ,false);
  std::ofstream::ofstream(local_8440,local_85b0,_S_out);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot write outfile \'",0x16);
    sVar9 = strlen(local_85b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_85b0,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    local_85c0 = 1;
    std::ostream::flush();
  }
  else {
    if (!bVar12) {
      std::ostream::seekp(local_8440,0,0);
    }
    arangodb::velocypack::Parser::steal((Parser *)(local_8558 + 0x10));
    if ((local_8510 & 1) == 0) {
      if ((local_8518 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8440,"\"",1);
        if (((uint8_t **)(local_8558._16_8_ + 0x18))[1] == (uint8_t *)0x0) {
          puVar10 = "";
        }
        else {
          puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8558._16_8_);
        }
        local_8588._M_unused._M_object = &local_8578;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8588,"");
        local_8568._0_8_ = local_8558;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8568,"\\x","");
        arangodb::velocypack::HexDump::HexDump
                  ((HexDump *)local_8498,(Slice)puVar10,0x800,(string *)&local_8588,
                   (string *)local_8568);
        poVar11 = arangodb::velocypack::operator<<((ostream *)local_8440,(HexDump *)local_8498);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        goto LAB_00104f94;
      }
      puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8558._16_8_);
      arangodb::velocypack::Builder::size((Builder *)local_8558._16_8_);
      std::ostream::write(local_8440,(long)puVar10);
    }
    else {
      if (((uint8_t **)(local_8558._16_8_ + 0x18))[1] == (uint8_t *)0x0) {
        puVar10 = "";
      }
      else {
        puVar10 = arangodb::velocypack::Builder::start((Builder *)local_8558._16_8_);
      }
      local_8588._M_unused._M_object = &local_8578;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8588," ","");
      local_8568._0_8_ = local_8558;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8568,"0x","");
      arangodb::velocypack::HexDump::HexDump
                ((HexDump *)local_8498,(Slice)puVar10,0x10,(string *)&local_8588,
                 (string *)local_8568);
      poVar11 = arangodb::velocypack::operator<<((ostream *)local_8440,(HexDump *)local_8498);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
LAB_00104f94:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8460._M_p != &local_8450) {
        operator_delete(local_8460._M_p,local_8450._M_allocated_capacity + 1);
      }
      if (_Stack_8480._M_p != local_8470) {
        operator_delete(_Stack_8480._M_p,local_8470._0_8_ + 1);
      }
      if ((Builder *)local_8568._0_8_ != (Builder *)local_8558) {
        operator_delete((void *)local_8568._0_8_,(ulong)(local_8558._0_8_ + 1));
      }
      if ((code **)local_8588._M_unused._0_8_ != &local_8578) {
        operator_delete(local_8588._M_unused._M_object,(ulong)(local_8578 + 1));
      }
    }
    std::ofstream::close();
    if (!bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully converted JSON infile \'",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_85a8._M_dataplus._M_p,
                           local_85a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"JSON Infile size:    ",0x15);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VPack Outfile size:  ",0x15);
      arangodb::velocypack::Builder::size((Builder *)local_8558._16_8_);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if (bVar3) {
        if (*(long *)((long)translator._M_t.
                            super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            .
                            super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                            ._M_head_impl + 0x78) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Key dictionary size: 0 (no benefit from compression)",
                     0x34);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Key dictionary size: ",0x15);
          local_8498._0_8_ =
               **(undefined8 **)
                 (*(long *)translator._M_t.
                           super___uniq_ptr_impl<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_arangodb::velocypack::AttributeTranslator_*,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                           .
                           super__Head_base<0UL,_arangodb::velocypack::AttributeTranslator_*,_false>
                           ._M_head_impl + 0x10);
          if ("\x01\x01"[(byte)*(code *)local_8498._0_8_] == '\0') {
            arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       local_8498,(uint8_t *)local_8498._0_8_);
          }
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
      }
    }
    if (local_8540 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8540);
    }
  }
  local_8440 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_8440 + (long)*(pointer *)(_VTT - 0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_8438);
  std::ios_base::~ios_base(local_8348);
  if ((element_type *)local_8508._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8508._8_8_);
  }
LAB_00105242:
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8538._M_dataplus._M_p != &local_8538.field_2) {
    operator_delete(local_8538._M_dataplus._M_p,
                    CONCAT71(local_8538.field_2._M_allocated_capacity._1_7_,
                             local_8538.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_85a8._M_dataplus._M_p != &local_85a8.field_2) {
    operator_delete(local_85a8._M_dataplus._M_p,local_85a8.field_2._M_allocated_capacity + 1);
  }
  return local_85c0;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool compact = true;
  bool compress = false;
  bool hexDump = false;
  bool stringify = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--compact")) {
      compact = true;
    } else if (allowFlags && isOption(p, "--no-compact")) {
      compact = false;
    } else if (allowFlags && isOption(p, "--compress")) {
      compress = true;
    } else if (allowFlags && isOption(p, "--no-compress")) {
      compress = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hexDump = true;
    } else if (allowFlags && isOption(p, "--stringify")) {
      stringify = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  char buffer[32768];
  s.reserve(sizeof(buffer));

  while (ifs.good()) {
    ifs.read(&buffer[0], sizeof(buffer));
    s.append(buffer, checkOverflow(ifs.gcount()));
  }
  ifs.close();

  Options options;
  options.buildUnindexedArrays = compact;
  options.buildUnindexedObjects = compact;

  // compress object keys?
  if (compress) {
    size_t compressedOccurrences = 0;
    std::unordered_map<std::string, size_t> keysFound;
    buildCompressedKeys(s, keysFound);

    std::vector<std::tuple<uint64_t, std::string, size_t>> stats;
    size_t requiredLength = 2;
    uint64_t nextId = 0;
    for (auto const& it : keysFound) {
      if (it.second > 1 && it.first.size() >= requiredLength) {
        translator->add(it.first, ++nextId);
        stats.emplace_back(std::make_tuple(nextId, it.first, it.second));

        if (translator->count() == 255) {
          requiredLength = 3;
        }
        compressedOccurrences += it.second;
      }
    }
    translator->seal();

    options.attributeTranslator = translator.get();

    // print statistics
    if (!toStdOut && compressedOccurrences > 0) {
      std::cout << compressedOccurrences
                << " occurrences of Object keys will be stored compressed:"
                << std::endl;

      size_t printed = 0;
      for (auto const& it : stats) {
        if (++printed > 20) {
          std::cout << " - ... " << (stats.size() - printed + 1)
                    << " Object key(s) follow ..." << std::endl;
          break;
        }
        std::cout << " - #" << std::get<0>(it) << ": " << std::get<1>(it)
                  << " (" << std::get<2>(it) << " occurrences)" << std::endl;
      }
    }
  }

  options.validateUtf8Strings = true;
  Parser parser(&options);
  try {
    parser.parse(s);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while parsing infile '" << infile
              << "': " << ex.what() << std::endl;
    std::cerr << "Error position: " << parser.errorPos() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while parsing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  std::shared_ptr<Builder> builder = parser.steal();
  if (hexDump) {
    ofs << HexDump(builder->slice()) << std::endl;
  } else if (stringify) {
    ofs << "\"" << HexDump(builder->slice(), 2048, "", "\\x") << "\""
        << std::endl;
  } else {
    uint8_t const* start = builder->start();
    ofs.write(reinterpret_cast<char const*>(start), builder->size());
  }

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "JSON Infile size:    " << s.size() << std::endl;
    std::cout << "VPack Outfile size:  " << builder->size() << std::endl;

    if (compress) {
      if (translator.get()->count() > 0) {
        std::cout << "Key dictionary size: "
                  << Slice(translator.get()->builder()->data()).byteSize()
                  << std::endl;
      } else {
        std::cout << "Key dictionary size: 0 (no benefit from compression)"
                  << std::endl;
      }
    }
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}